

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLCOLLADACsymbol.cpp
# Opt level: O2

int __thiscall
COLLADASaxFWL::COLLADACsymbol::clone
          (COLLADACsymbol *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CSymbolType CVar1;
  COLLADACsymbol *this_00;
  
  CVar1 = this->mCSymbolType;
  this_00 = (COLLADACsymbol *)operator_new(0xe0);
  if (CVar1 == PARAMETER) {
    COLLADACsymbol(this_00,&this->mSidAddress);
  }
  else {
    COLLADACsymbol(this_00,&this->mFunctionName,&this->mFormulaUniqueId);
  }
  return (int)this_00;
}

Assistant:

MathML::AST::INode* COLLADACsymbol::clone(CloneFlags cloneFlags) const
	{
		COLLADACsymbol* copy = 0;
		if ( mCSymbolType == PARAMETER)
		{
			copy = new COLLADACsymbol( mSidAddress );
		}
		else
		{
			copy = new COLLADACsymbol( mFunctionName, mFormulaUniqueId );
		}
		return copy;
	}